

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageLite::ParseFromString(MessageLite *this,string *data)

{
  int iVar1;
  LogMessage *other;
  MessageLite *message;
  undefined1 uVar2;
  LogFinisher local_b1;
  CodedInputStream local_b0;
  string local_60;
  LogMessage local_40;
  
  local_b0.buffer_ = (uint8 *)(data->_M_dataplus)._M_p;
  local_b0.total_bytes_read_ = (int)data->_M_string_length;
  local_b0.buffer_end_ = local_b0.buffer_ + local_b0.total_bytes_read_;
  local_b0.input_ = (ZeroCopyInputStream *)0x0;
  local_b0.overflow_bytes_ = 0;
  local_b0.last_tag_ = 0;
  local_b0.legitimate_message_end_ = false;
  local_b0.aliasing_enabled_ = false;
  local_b0.buffer_size_after_limit_ = 0;
  local_b0.total_bytes_limit_ = 0x7fffffff;
  local_b0.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_b0.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_b0.disable_strict_correctness_enforcement_ = true;
  local_b0.extension_pool_ = (DescriptorPool *)0x0;
  local_b0.extension_factory_ = (MessageFactory *)0x0;
  local_b0.current_limit_ = local_b0.total_bytes_read_;
  (*this->_vptr_MessageLite[7])();
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,&local_b0);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_MessageLite[8])(this);
    if ((char)iVar1 != '\0') {
      uVar2 = local_b0.legitimate_message_end_;
      goto LAB_002c00c5;
    }
    message = (MessageLite *)0x79;
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x79);
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_60,(_anonymous_namespace_ *)"parse",(char *)this,message);
    other = internal::LogMessage::operator<<(&local_40,&local_60);
    internal::LogFinisher::operator=(&local_b1,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_40);
  }
  uVar2 = 0;
LAB_002c00c5:
  io::CodedInputStream::~CodedInputStream(&local_b0);
  return (bool)uVar2;
}

Assistant:

bool MessageLite::ParseFromString(const string& data) {
  return InlineParseFromArray(data.data(), data.size(), this);
}